

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_abs_i32_ppc64(TCGContext_conflict10 *tcg_ctx,TCGv_i32 ret,TCGv_i32 a)

{
  TCGv_i32 ret_00;
  TCGv_i32 t;
  TCGv_i32 a_local;
  TCGv_i32 ret_local;
  TCGContext_conflict10 *tcg_ctx_local;
  
  ret_00 = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_sari_i32_ppc64(tcg_ctx,ret_00,a,0x1f);
  tcg_gen_xor_i32(tcg_ctx,ret,a,ret_00);
  tcg_gen_sub_i32(tcg_ctx,ret,ret,ret_00);
  tcg_temp_free_i32(tcg_ctx,ret_00);
  return;
}

Assistant:

void tcg_gen_abs_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 a)
{
    TCGv_i32 t = tcg_temp_new_i32(tcg_ctx);

    tcg_gen_sari_i32(tcg_ctx, t, a, 31);
    tcg_gen_xor_i32(tcg_ctx, ret, a, t);
    tcg_gen_sub_i32(tcg_ctx, ret, ret, t);
    tcg_temp_free_i32(tcg_ctx, t);
}